

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O1

int anon_unknown.dwarf_f484::extract_job_number(string *command,string *jobString)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  unsigned_long numJobs;
  unsigned_long local_20;
  
  local_20 = 0;
  if (jobString->_M_string_length == 0) {
    local_20 = 0;
  }
  else {
    bVar1 = cmStrToULong(jobString,&local_20);
    if (bVar1) {
      if (local_20 == 0) {
        poVar4 = (ostream *)&std::cerr;
        pcVar3 = "The <jobs> value requires a positive integer argument.\n\n";
        lVar2 = 0x38;
      }
      else {
        if (local_20 >> 0x1f == 0) goto LAB_0019178a;
        poVar4 = (ostream *)&std::cerr;
        pcVar3 = "The <jobs> value is too large.\n\n";
        lVar2 = 0x20;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(command->_M_dataplus)._M_p,
                          command->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\' invalid number \'",0x12);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(jobString->_M_dataplus)._M_p,jobString->_M_string_length);
      pcVar3 = "\' given.\n\n";
      lVar2 = 10;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,lVar2);
    local_20 = 0xffffffff;
  }
LAB_0019178a:
  return (int)local_20;
}

Assistant:

int extract_job_number(std::string const& command,
                       std::string const& jobString)
{
  int jobs = -1;
  unsigned long numJobs = 0;
  if (jobString.empty()) {
    jobs = cmake::DEFAULT_BUILD_PARALLEL_LEVEL;
  } else if (cmStrToULong(jobString, &numJobs)) {
    if (numJobs == 0) {
      std::cerr
        << "The <jobs> value requires a positive integer argument.\n\n";
    } else if (numJobs > INT_MAX) {
      std::cerr << "The <jobs> value is too large.\n\n";
    } else {
      jobs = static_cast<int>(numJobs);
    }
  } else {
    std::cerr << "'" << command << "' invalid number '" << jobString
              << "' given.\n\n";
  }
  return jobs;
}